

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

bool __thiscall
wasm::Match::Internal::MatchSelf<wasm::Match::Internal::NumberLitKind>::operator()
          (MatchSelf<wasm::Match::Internal::NumberLitKind> *this,Literal *lit,int32_t expected)

{
  Type type;
  bool bVar1;
  Literal local_38;
  
  type.id = (lit->type).id;
  if (type.id - 2 < 5) {
    Literal::makeFromInt32(&local_38,expected,type);
    bVar1 = Literal::operator==(&local_38,lit);
    Literal::~Literal(&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(Literal lit, int32_t expected) {
    return lit.type.isNumber() &&
           Literal::makeFromInt32(expected, lit.type) == lit;
  }